

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

void __thiscall re2::ByteMapBuilder::Build(ByteMapBuilder *this,uint8_t *bytemap,int *bytemap_range)

{
  int iVar1;
  int iVar2;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  long in_RSI;
  long in_RDI;
  int unaff_retaddr;
  ByteMapBuilder *in_stack_00000008;
  uint8_t b;
  int next;
  int c;
  int c_00;
  Bitmap256 *this_00;
  
  this_00 = (Bitmap256 *)CONCAT71(in_register_00000011,in_DL);
  *(undefined4 *)(in_RDI + 0x420) = 0;
  c_00 = 0;
  while (c_00 < 0x100) {
    iVar1 = Bitmap256::FindNextSetBit(this_00,c_00);
    iVar2 = Recolor(in_stack_00000008,unaff_retaddr);
    for (; c_00 <= iVar1; c_00 = c_00 + 1) {
      *(char *)(in_RSI + c_00) = (char)iVar2;
    }
  }
  *(undefined4 *)this_00->words_ = *(undefined4 *)(in_RDI + 0x420);
  return;
}

Assistant:

void ByteMapBuilder::Build(uint8_t* bytemap, int* bytemap_range) {
  // Assign byte classes numbered from 0.
  nextcolor_ = 0;

  int c = 0;
  while (c < 256) {
    int next = splits_.FindNextSetBit(c);
    uint8_t b = static_cast<uint8_t>(Recolor(colors_[next]));
    while (c <= next) {
      bytemap[c] = b;
      c++;
    }
  }

  *bytemap_range = nextcolor_;
}